

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mysqlaux.c
# Opt level: O2

int quote_sql_str(lua_State *L)

{
  char cVar1;
  int iVar2;
  size_t in_RAX;
  char *__src;
  char *s;
  size_t sVar3;
  size_t sVar4;
  uint n;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *__dest;
  size_t len;
  
  len = in_RAX;
  iVar2 = lua_gettop(L);
  if (iVar2 != 1) {
    iVar2 = luaL_error(L,"expecting one argument");
    return iVar2;
  }
  iVar2 = 1;
  __src = luaL_checklstring(L,1,&len);
  if (len == 0) {
    lua_pushlstring(L,"\'\'",2);
  }
  else {
    uVar5 = 0;
    for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
      if ((-1 < __src[sVar4]) &&
         (((uVar6 = (uint)(byte)__src[sVar4], uVar6 < 0x28 &&
           ((0x8404002701U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) || (uVar6 == 0x5c)))) {
        uVar5 = uVar5 + 1;
      }
    }
    sVar4 = len + uVar5 + 2;
    s = (char *)lua_newuserdata(L,sVar4);
    __dest = s + 1;
    *s = '\'';
    if (uVar5 == 0) {
      memcpy(__dest,__src,len);
      __dest = __dest + len;
    }
    else {
      for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
        cVar1 = __src[sVar3];
        pcVar7 = __dest + 1;
        if (cVar1 < '\0') {
switchD_001165e5_caseD_b:
          *__dest = cVar1;
        }
        else {
          switch(cVar1) {
          case '\b':
            __dest[0] = '\\';
            __dest[1] = 'b';
            break;
          case '\t':
            __dest[0] = '\\';
            __dest[1] = 't';
            break;
          case '\n':
            __dest[0] = '\\';
            __dest[1] = 'n';
            break;
          case '\v':
          case '\f':
            goto switchD_001165e5_caseD_b;
          case '\r':
            __dest[0] = '\\';
            __dest[1] = 'r';
            break;
          default:
            if (cVar1 == '\\') {
              __dest[0] = '\\';
              __dest[1] = '\\';
            }
            else if (cVar1 == '\x1a') {
              __dest[0] = '\\';
              __dest[1] = 'Z';
            }
            else if (cVar1 == '\"') {
              __dest[0] = '\\';
              __dest[1] = '\"';
            }
            else if (cVar1 == '\'') {
              __dest[0] = '\\';
              __dest[1] = '\'';
            }
            else {
              if (cVar1 != '\0') goto switchD_001165e5_caseD_b;
              __dest[0] = '\\';
              __dest[1] = '0';
            }
          }
          pcVar7 = __dest + 2;
        }
        __dest = pcVar7;
      }
    }
    *__dest = '\'';
    if (__dest + 1 == s + sVar4) {
      lua_pushlstring(L,s,(long)(__dest + 1) - (long)s);
      iVar2 = 1;
    }
    else {
      iVar2 = luaL_error(L,"quote sql string error");
    }
  }
  return iVar2;
}

Assistant:

static int
quote_sql_str(lua_State *L)
{
    size_t                   len, dlen, escape;
    unsigned char                  *p;
    unsigned char                  *src, *dst;
    
    if (lua_gettop(L) != 1) {
        return luaL_error(L, "expecting one argument");
    }
    
    src = (unsigned char *) luaL_checklstring(L, 1, &len);
    
    if (len == 0) {
        dst = (unsigned char *) "''";
        dlen = sizeof("''") - 1;
        lua_pushlstring(L, (char *) dst, dlen);
        return 1;
    }
    
    escape = num_escape_sql_str(NULL, src, len);
    
    dlen = sizeof("''") - 1 + len + escape;
    p = lua_newuserdata(L, dlen);
    
    dst = p;
    
    *p++ = '\'';
    
    if (escape == 0) {
        memcpy(p, src, len);
        p+=len;
    } else {
        p = (unsigned char *) escape_sql_str(p, src, len);
    }
    
    *p++ = '\'';
    
    if (p != dst + dlen) {
        return luaL_error(L, "quote sql string error");
    }
    
    lua_pushlstring(L, (char *) dst, p - dst);
    
    return 1;
}